

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

bool megumax::legal_pv(Position *pos,MoveList *move_list)

{
  pointer pMVar1;
  int iVar2;
  bool bVar3;
  MoveList *__range1;
  int iVar4;
  Move *move;
  pointer pMVar5;
  
  pMVar5 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  while ((iVar2 = iVar4, pMVar5 != pMVar1 &&
         (bVar3 = libchess::Position::is_legal_move(pos,(Move)pMVar5->value_), bVar3))) {
    libchess::Position::make_move(pos,(Move)pMVar5->value_);
    iVar4 = iVar4 + 1;
    pMVar5 = pMVar5 + 1;
  }
  while (iVar2 != 0) {
    libchess::Position::unmake_move(pos);
    iVar2 = iVar2 + -1;
  }
  return (int)((ulong)((long)(move_list->values_).
                             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(move_list->values_).
                            super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2) == iVar4;
}

Assistant:

bool legal_pv(Position& pos, MoveList&& move_list) {
    int ply = 0;

    for (const auto& move : move_list) {
        if (pos.is_legal_move(move)) {
            pos.make_move(move);
            ply++;
        } else {
            break;
        }
    }

    for (int i = 0; i < ply; ++i) {
        pos.unmake_move();
    }

    return ply == move_list.size();
}